

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall cmGraphVizWriter::WriteGlobalFile(cmGraphVizWriter *this,char *fileName)

{
  _Rb_tree_header *p_Var1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  TargetType targetType;
  size_t sVar3;
  cmGraphVizWriter *this_01;
  cmGraphVizWriter *pcVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedConnections;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedNodes;
  cmGeneratedFileStream str;
  undefined1 local_2d8 [32];
  _Base_ptr local_2b8;
  size_t local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_278 [584];
  
  CollectTargetsAndLibs(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,fileName,(allocator<char> *)&local_2a8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(string *)local_2d8,false,None);
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    WriteHeader(this,(cmGeneratedFileStream *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing ",8);
    if (fileName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5cd740);
    }
    else {
      sVar3 = strlen(fileName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    this_01 = (cmGraphVizWriter *)std::ostream::put('@');
    std::ostream::flush();
    local_2d8._24_8_ = local_2d8 + 8;
    local_2d8._8_4_ = _S_red;
    local_2d8._16_8_ = 0;
    local_2b0 = 0;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2a8._M_impl.super__Rb_tree_header._M_header;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    pcVar4 = (cmGraphVizWriter *)
             (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
    local_2b8 = (_Base_ptr)local_2d8._24_8_;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pcVar4 != (cmGraphVizWriter *)p_Var1) {
      do {
        this_01 = pcVar4;
        this_00 = (cmGeneratorTarget *)(this_01->GraphHeader)._M_dataplus._M_p;
        if (this_00 != (cmGeneratorTarget *)0x0) {
          targetType = cmGeneratorTarget::GetType(this_00);
          bVar2 = GenerateForTargetType(this,targetType);
          if (bVar2) {
            WriteConnections(this,&this_01->GraphName,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_2a8,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2d8,(cmGeneratedFileStream *)local_278);
          }
        }
        pcVar4 = (cmGraphVizWriter *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
      } while (pcVar4 != (cmGraphVizWriter *)p_Var1);
    }
    WriteFooter(this_01,(cmGeneratedFileStream *)local_278);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d8);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmGraphVizWriter::WriteGlobalFile(const char* fileName)
{
  this->CollectTargetsAndLibs();

  cmGeneratedFileStream str(fileName);
  if (!str) {
    return;
  }
  this->WriteHeader(str);

  std::cout << "Writing " << fileName << "..." << std::endl;

  std::set<std::string> insertedConnections;
  std::set<std::string> insertedNodes;

  for (auto const& ptr : this->TargetPtrs) {
    if (ptr.second == nullptr) {
      continue;
    }

    if (!this->GenerateForTargetType(ptr.second->GetType())) {
      continue;
    }

    this->WriteConnections(ptr.first, insertedNodes, insertedConnections, str);
  }
  this->WriteFooter(str);
}